

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O2

void __thiscall muduo::Thread::start(Thread *this)

{
  int iVar1;
  ThreadData *this_00;
  void *__stat_loc;
  SourceFile file;
  function<void_()> local_1020;
  undefined1 local_1000 [12];
  Logger local_ff0;
  
  this->started_ = true;
  this_00 = (ThreadData *)operator_new(0x50);
  std::function<void_()>::function(&local_1020,&this->func_);
  detail::ThreadData::ThreadData(this_00,&local_1020,&this->name_,&this->tid_,&this->latch_);
  std::_Function_base::~_Function_base(&local_1020.super__Function_base);
  __stat_loc = (void *)0x0;
  iVar1 = pthread_create(&this->pthreadId_,(pthread_attr_t *)0x0,detail::startThread,this_00);
  if (iVar1 == 0) {
    CountDownLatch::wait(&this->latch_,__stat_loc);
  }
  else {
    this->started_ = false;
    detail::ThreadData::~ThreadData(this_00);
    operator_delete(this_00);
    Logger::SourceFile::SourceFile<99>
              ((SourceFile *)local_1000,
               (char (*) [99])
               "/workspace/llm4binary/github/license_all_cmakelists_25/IMIdealDragon[P]flydragon/logging/Thread.cc"
              );
    file._12_4_ = 0;
    file.data_ = (char *)local_1000._0_8_;
    file.size_ = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0xb7,true);
    LogStream::operator<<(&local_ff0.impl_.stream_,"Failed in pthread_create");
    Logger::~Logger(&local_ff0);
  }
  return;
}

Assistant:

void Thread::start()
{
  assert(!started_);
  started_ = true;
  // FIXME: move(func_)
  detail::ThreadData* data = new detail::ThreadData(func_, name_, &tid_, &latch_);
  if (pthread_create(&pthreadId_, NULL, &detail::startThread, data))
  {
    started_ = false;
    delete data; // or no delete?
    LOG_SYSFATAL << "Failed in pthread_create";
  }
  else
  {
    latch_.wait();
    assert(tid_ > 0);
  }
}